

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_78::BinaryReaderIR::BeginDataSegment
          (BinaryReaderIR *this,Index index,Index memory_index,uint8_t flags)

{
  DataSegmentModuleField *pDVar1;
  _Head_base<0UL,_wabt::DataSegmentModuleField_*,_false> local_a8;
  DataSegmentModuleField *local_a0;
  Location local_98;
  Var local_78;
  
  GetLocation(&local_78.loc,this);
  MakeUnique<wabt::DataSegmentModuleField,wabt::Location>((wabt *)&local_a0,&local_78.loc);
  pDVar1 = local_a0;
  GetLocation(&local_98,this);
  Var::Var(&local_78,memory_index,&local_98);
  Var::operator=(&(pDVar1->data_segment).memory_var,&local_78);
  Var::~Var(&local_78);
  (pDVar1->data_segment).kind = flags & Passive;
  local_a8._M_head_impl = local_a0;
  local_a0 = (DataSegmentModuleField *)0x0;
  Module::AppendField(this->module_,
                      (unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
                       *)&local_a8);
  if (local_a8._M_head_impl != (DataSegmentModuleField *)0x0) {
    (*((local_a8._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)8>).super_ModuleField.
      _vptr_ModuleField[1])();
  }
  local_a8._M_head_impl = (DataSegmentModuleField *)0x0;
  if (local_a0 != (DataSegmentModuleField *)0x0) {
    (**(code **)(*(long *)local_a0 + 8))();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::BeginDataSegment(Index index,
                                        Index memory_index,
                                        uint8_t flags) {
  auto field = MakeUnique<DataSegmentModuleField>(GetLocation());
  DataSegment& data_segment = field->data_segment;
  data_segment.memory_var = Var(memory_index, GetLocation());
  if ((flags & SegPassive) == SegPassive) {
    data_segment.kind = SegmentKind::Passive;
  } else {
    data_segment.kind = SegmentKind::Active;
  }
  module_->AppendField(std::move(field));
  return Result::Ok;
}